

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall glslang::TParseContext::variableCheck(TParseContext *this,TIntermTyped **nodePtr)

{
  TIntermediate *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar4;
  long lVar5;
  TSourceLoc *pTVar6;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar7;
  size_t s;
  TVariable *this_01;
  TString *name;
  TIntermSymbol *pTVar8;
  TType local_c8;
  long *plVar3;
  
  iVar2 = (*((*nodePtr)->super_TIntermNode)._vptr_TIntermNode[0xc])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar3 != (long *)0x0) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0xf0))(plVar3);
    iVar2 = (**(code **)(*plVar4 + 0x38))(plVar4);
    if (iVar2 == 0) {
      if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan != 0) {
        pbVar7 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 (**(code **)(*plVar3 + 400))(plVar3);
        bVar1 = std::operator==(pbVar7,"gl_VertexID");
        if ((!bVar1) &&
           ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan != 0)) {
          pbVar7 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   (**(code **)(*plVar3 + 400))(plVar3);
          std::operator==(pbVar7,"gl_InstanceID");
        }
      }
      s = (**(code **)*plVar3)(plVar3);
      lVar5 = (**(code **)(*plVar3 + 400))(plVar3);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,s,"undeclared identifier",*(undefined8 *)(lVar5 + 8));
      lVar5 = (**(code **)(*plVar3 + 400))(plVar3);
      if (*(long *)(lVar5 + 0x10) != 0) {
        this_01 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,s);
        name = (TString *)(**(code **)(*plVar3 + 400))(plVar3);
        TType::TType(&local_c8,EbtFloat,EvqTemporary,1,0,0,false);
        TVariable::TVariable(this_01,name,&local_c8,false);
        TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_01);
        this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar6 = (TSourceLoc *)(**(code **)*plVar3)(plVar3);
        pTVar8 = TIntermediate::addSymbol(this_00,this_01,pTVar6);
        *nodePtr = &pTVar8->super_TIntermTyped;
      }
    }
    else {
      lVar5 = (**(code **)(*plVar3 + 0x108))(plVar3);
      if ((*(uint *)(lVar5 + 8) & 0x7f) == 0x1b) {
        pTVar6 = (TSourceLoc *)(**(code **)*plVar3)(plVar3);
        TParseVersions::profileRequires
                  ((TParseVersions *)this,pTVar6,1,0x78,(char *)0x0,"gl_PointCoord");
        return;
      }
    }
  }
  return;
}

Assistant:

void TParseContext::variableCheck(TIntermTyped*& nodePtr)
{
    TIntermSymbol* symbol = nodePtr->getAsSymbolNode();
    if (! symbol)
        return;

    if (symbol->getType().getBasicType() == EbtVoid) {
        const char *extraInfoFormat = "";
        if (spvVersion.vulkan != 0 && symbol->getName() == "gl_VertexID") {
          extraInfoFormat = "(Did you mean gl_VertexIndex?)";
        } else if (spvVersion.vulkan != 0 && symbol->getName() == "gl_InstanceID") {
          extraInfoFormat = "(Did you mean gl_InstanceIndex?)";
        }
        error(symbol->getLoc(), "undeclared identifier", symbol->getName().c_str(), extraInfoFormat);

        // Add to symbol table to prevent future error messages on the same name
        if (symbol->getName().size() > 0) {
            TVariable* fakeVariable = new TVariable(&symbol->getName(), TType(EbtFloat));
            symbolTable.insert(*fakeVariable);

            // substitute a symbol node for this new variable
            nodePtr = intermediate.addSymbol(*fakeVariable, symbol->getLoc());
        }
    } else {
        switch (symbol->getQualifier().storage) {
        case EvqPointCoord:
            profileRequires(symbol->getLoc(), ENoProfile, 120, nullptr, "gl_PointCoord");
            break;
        default: break; // some compilers want this
        }
    }
}